

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.cpp
# Opt level: O1

void duckdb_brotli::BrotliCompressFragmentFast
               (BrotliOnePassArena *s,uint8_t *input,size_t input_size,int is_last,int *table,
               size_t table_size,size_t *storage_ix,uint8_t *storage)

{
  ulong uVar1;
  int iVar2;
  size_t storage_ix_start;
  
  storage_ix_start = *storage_ix;
  if (input_size != 0) {
    iVar2 = 0x1f;
    if ((uint)table_size != 0) {
      for (; (uint)table_size >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    switch(iVar2) {
    case 9:
      BrotliCompressFragmentFastImpl9(s,input,input_size,is_last,table,storage_ix,storage);
      break;
    case 0xb:
      BrotliCompressFragmentFastImpl11(s,input,input_size,is_last,table,storage_ix,storage);
      break;
    case 0xd:
      BrotliCompressFragmentFastImpl13(s,input,input_size,is_last,table,storage_ix,storage);
      break;
    case 0xf:
      BrotliCompressFragmentFastImpl15(s,input,input_size,is_last,table,storage_ix,storage);
    }
    if (input_size * 8 + 0x1f < *storage_ix - storage_ix_start) {
      EmitUncompressedMetaBlock(input,input + input_size,storage_ix_start,storage_ix,storage);
    }
    if (is_last == 0) {
      return;
    }
    storage_ix_start = *storage_ix;
  }
  *(ulong *)(storage + (storage_ix_start >> 3)) =
       (ulong)storage[storage_ix_start >> 3] | 1L << ((byte)storage_ix_start & 7);
  uVar1 = storage_ix_start + 1;
  *storage_ix = uVar1;
  *(ulong *)(storage + (uVar1 >> 3)) = (ulong)storage[uVar1 >> 3] | 1L << ((byte)uVar1 & 7);
  *storage_ix = (ulong)((int)storage_ix_start + 9U & 0xfffffff8);
  return;
}

Assistant:

void duckdb_brotli::BrotliCompressFragmentFast(
    BrotliOnePassArena* s, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, int* table, size_t table_size,
    size_t* storage_ix, uint8_t* storage) {
  const size_t initial_storage_ix = *storage_ix;
  const size_t table_bits = Log2FloorNonZero(table_size);

  if (input_size == 0) {
    BROTLI_DCHECK(is_last);
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
    return;
  }

  switch (table_bits) {
#define CASE_(B)                                                     \
    case B:                                                          \
      BrotliCompressFragmentFastImpl ## B(                           \
          s, input, input_size, is_last, table, storage_ix, storage);\
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: BROTLI_DCHECK(0); break;
  }

  /* If output is larger than single uncompressed block, rewrite it. */
  if (*storage_ix - initial_storage_ix > 31 + (input_size << 3)) {
    EmitUncompressedMetaBlock(input, input + input_size, initial_storage_ix,
                              storage_ix, storage);
  }

  if (is_last) {
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
  }
}